

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.h
# Opt level: O0

void __thiscall PresolveComponentData::~PresolveComponentData(PresolveComponentData *this)

{
  HighsBasis *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__PresolveComponentData_001b6b10;
  HighsPresolveLog::~HighsPresolveLog((HighsPresolveLog *)0x17ebad);
  HighsBasis::~HighsBasis(in_RDI);
  HighsSolution::~HighsSolution((HighsSolution *)in_RDI);
  presolve::HighsPostsolveStack::~HighsPostsolveStack((HighsPostsolveStack *)in_RDI);
  HighsLp::~HighsLp((HighsLp *)in_RDI);
  return;
}

Assistant:

virtual ~PresolveComponentData() = default;